

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers_iforest.hpp
# Opt level: O2

void __thiscall
RecursionState::RecursionState<WorkerMemory<ImputedData<int,double>,double,float>>
          (RecursionState *this,WorkerMemory<ImputedData<int,_double>,_double,_float> *workspace,
          bool full_state)

{
  unique_ptr<double[],_std::default_delete<double[]>_> *this_00;
  pointer puVar1;
  pointer pdVar2;
  size_t sVar3;
  double *pdVar4;
  pointer __p;
  pointer __p_00;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  bool bVar8;
  pair<tsl::detail_robin_hash::robin_hash<std::pair<unsigned_long,_double>,_tsl::robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::KeySelect,_tsl::robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::ValueSelect,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::robin_iterator<false>,_bool>
  pVar9;
  allocator_type local_59;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_58;
  vector<double,_std::allocator<double>_> *local_50;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_48;
  
  local_58 = &this->ix_arr;
  (this->cols_possible).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (this->cols_possible).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_offset = 0;
  local_50 = &this->col_sampler_weights;
  this_00 = &this->weights_arr;
  (this->ix_arr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->ix_arr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->ix_arr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->cols_possible).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (this->cols_possible).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_offset = 0;
  (this->cols_possible).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)0x0;
  (this->col_sampler_weights).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->col_sampler_weights).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->col_sampler_weights).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->weights_arr)._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
  super__Head_base<0UL,_double_*,_false>._M_head_impl = (double *)0x0;
  this->full_state = full_state;
  this->split_ix = workspace->split_ix;
  this->end = workspace->end;
  if ((workspace->col_sampler).tree_weights.super__Vector_base<double,_std::allocator<double>_>.
      _M_impl.super__Vector_impl_data._M_start ==
      (workspace->col_sampler).tree_weights.super__Vector_base<double,_std::allocator<double>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    this->sampler_pos = (workspace->col_sampler).curr_pos;
    if (!full_state) {
      return;
    }
  }
  else {
    std::vector<double,_std::allocator<double>_>::operator=
              (local_50,&(workspace->col_sampler).tree_weights);
    this->n_dropped = (workspace->col_sampler).n_dropped;
    if ((this->full_state & 1U) == 0) {
      return;
    }
  }
  this->st = workspace->st;
  uVar5 = workspace->st_NA;
  this->st_NA = uVar5;
  uVar6 = workspace->end_NA;
  this->end_NA = uVar6;
  this->changed_weights = workspace->changed_weights;
  if (uVar5 < uVar6 &&
      (workspace->comb_val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (workspace->comb_val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    puVar1 = (workspace->ix_arr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
    std::vector<unsigned_long,std::allocator<unsigned_long>>::
    vector<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,void>
              ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_48,
               (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                )(puVar1 + uVar5),
               (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                )(puVar1 + uVar6),&local_59);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_move_assign(local_58,&local_48);
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_48);
    if (this->changed_weights == true) {
      uVar5 = workspace->end_NA - workspace->st_NA;
      __p_00 = (pointer)operator_new__(-(ulong)(uVar5 >> 0x3d != 0) | uVar5 * 8);
      local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      std::__uniq_ptr_impl<double,_std::default_delete<double[]>_>::reset
                ((__uniq_ptr_impl<double,_std::default_delete<double[]>_> *)this_00,__p_00);
      std::unique_ptr<double[],_std::default_delete<double[]>_>::~unique_ptr
                ((unique_ptr<double[],_std::default_delete<double[]>_> *)&local_48);
      pdVar2 = (workspace->weights_arr).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (pdVar2 == (workspace->weights_arr).super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_finish) {
        lVar7 = 0;
        while (bVar8 = uVar5 != 0, uVar5 = uVar5 - 1, bVar8) {
          pVar9 = tsl::detail_robin_hash::
                  robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                  ::try_emplace<unsigned_long_const&>
                            ((robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                              *)&workspace->weights_map,
                             (unsigned_long *)
                             ((long)(workspace->ix_arr).
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_start +
                             lVar7 + workspace->st_NA * 8));
          *(undefined8 *)
           ((long)(this_00->_M_t).super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t
                  .super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                  super__Head_base<0UL,_double_*,_false>._M_head_impl + lVar7) =
               *(undefined8 *)((pVar9.first.m_bucket.m_bucket)->m_value + 8);
          lVar7 = lVar7 + 8;
        }
      }
      else {
        sVar3 = workspace->st_NA;
        puVar1 = (workspace->ix_arr).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar4 = (this_00->_M_t).super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                 super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                 super__Head_base<0UL,_double_*,_false>._M_head_impl;
        for (uVar6 = 0; uVar5 != uVar6; uVar6 = uVar6 + 1) {
          pdVar4[uVar6] = pdVar2[puVar1[sVar3 + uVar6]];
        }
      }
    }
  }
  return;
}

Assistant:

RecursionState::RecursionState(WorkerMemory &workspace, bool full_state)
{
    this->full_state = full_state;

    this->split_ix         =  workspace.split_ix;
    this->end              =  workspace.end;
    if (!workspace.col_sampler.has_weights())
        this->sampler_pos  =  workspace.col_sampler.curr_pos;
    else {
        this->col_sampler_weights = workspace.col_sampler.tree_weights;
        this->n_dropped           = workspace.col_sampler.n_dropped;
    }

    if (this->full_state)
    {
        this->st           = workspace.st;
        this->st_NA        = workspace.st_NA;
        this->end_NA       = workspace.end_NA;

        this->changed_weights = workspace.changed_weights;

        /* for the extended model, it's not necessary to copy everything */
        if (workspace.comb_val.empty() && workspace.st_NA < workspace.end_NA)
        {
            this->ix_arr = std::vector<size_t>(workspace.ix_arr.begin() + workspace.st_NA,
                                               workspace.ix_arr.begin() + workspace.end_NA);
            if (this->changed_weights)
            {
                size_t tot = workspace.end_NA - workspace.st_NA;
                this->weights_arr = std::unique_ptr<double[]>(new double[tot]);
                if (!workspace.weights_arr.empty())
                    for (size_t ix = 0; ix < tot; ix++)
                        this->weights_arr[ix] = workspace.weights_arr[workspace.ix_arr[ix + workspace.st_NA]];
                else
                    for (size_t ix = 0; ix < tot; ix++)
                        this->weights_arr[ix] = workspace.weights_map[workspace.ix_arr[ix + workspace.st_NA]];
            }
        }
    }
}